

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn_logistic<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  int iVar2;
  pointer pfVar3;
  int i;
  size_t i_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_48;
  float fStack_44;
  
  fVar1 = ec->weight;
  iVar2 = o->t + 1;
  fVar4 = (float)iVar2;
  o->t = iVar2;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_48 = 0.0;
  fStack_44 = 0.0;
  for (i_00 = 0; (long)i_00 < (long)o->N; i_00 = i_00 + 1) {
    fVar5 = expf(local_48);
    ec->weight = (1.0 / (fVar5 + 1.0)) * fVar1;
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    fVar6 = (ec->l).simple.label * (ec->pred).scalar;
    fVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[i_00];
    local_48 = local_48 + fVar5 * fVar6;
    fStack_44 = fStack_44 + fVar5 * (ec->pred).scalar;
    fVar5 = expf(local_48);
    pfVar3 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3[i_00] = ((4.0 / fVar4) * fVar6) / (fVar5 + 1.0) + pfVar3[i_00];
    pfVar3 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar5 = pfVar3[i_00];
    if (2.0 < fVar5) {
      pfVar3[i_00] = 2.0;
      pfVar3 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar5 = pfVar3[i_00];
    }
    if (fVar5 < -2.0) {
      pfVar3[i_00] = -2.0;
    }
    LEARNER::learner<char,_example>::learn(base,ec,i_00);
  }
  ec->weight = fVar1;
  ec->partial_prediction = fStack_44;
  fVar4 = *(float *)(&DAT_0023b6d8 + (ulong)(0.0 < fStack_44) * 4);
  (ec->pred).scalar = fVar4;
  ec->loss = (float)(~-(uint)(fVar4 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}